

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
__thiscall duckdb::GetBaseStatsUnifier(duckdb *this,LogicalType *type)

{
  PhysicalType PVar1;
  uint8_t scale;
  uint8_t width;
  uint8_t local_1a;
  uint8_t local_19;
  undefined8 local_18;
  
  switch(type->id_) {
  default:
switchD_01ec5ee6_caseD_a:
    make_uniq<duckdb::NullStatsUnifier>();
    break;
  case TINYINT:
  case SMALLINT:
  case INTEGER:
  case UTINYINT:
  case USMALLINT:
    make_uniq<duckdb::NumericStatsUnifier<int>>();
    break;
  case BIGINT:
    make_uniq<duckdb::NumericStatsUnifier<long>>();
    break;
  case DATE:
    make_uniq<duckdb::NumericStatsUnifier<duckdb::date_t>>();
    break;
  case TIME:
    make_uniq<duckdb::NumericStatsUnifier<duckdb::dtime_t>>();
    break;
  case TIMESTAMP_SEC:
  case TIMESTAMP:
    make_uniq<duckdb::NumericStatsUnifier<duckdb::timestamp_t>>();
    break;
  case TIMESTAMP_MS:
    make_uniq<duckdb::NumericStatsUnifier<duckdb::timestamp_ms_t>>();
    break;
  case TIMESTAMP_NS:
    make_uniq<duckdb::NumericStatsUnifier<duckdb::timestamp_ns_t>>();
    break;
  case DECIMAL:
    local_19 = DecimalType::GetWidth(type);
    local_1a = DecimalType::GetScale(type);
    PVar1 = type->physical_type_;
    if (PVar1 != INT16) {
      if (PVar1 == INT64) {
        make_uniq<duckdb::DecimalStatsUnifier<long>,unsigned_char&,unsigned_char&>
                  ((duckdb *)&local_18,&local_19,&local_1a);
        break;
      }
      if (PVar1 != INT32) goto switchD_01ec5ee6_caseD_a;
    }
    make_uniq<duckdb::DecimalStatsUnifier<int>,unsigned_char&,unsigned_char&>
              ((duckdb *)&local_18,&local_19,&local_1a);
    break;
  case FLOAT:
    make_uniq<duckdb::NumericStatsUnifier<float>>();
    break;
  case DOUBLE:
  case UHUGEINT:
  case HUGEINT:
    make_uniq<duckdb::NumericStatsUnifier<double>>();
    break;
  case VARCHAR:
    make_uniq<duckdb::StringStatsUnifier>();
    break;
  case BLOB:
    make_uniq<duckdb::BlobStatsUnifier>();
    break;
  case UINTEGER:
    make_uniq<duckdb::NumericStatsUnifier<unsigned_int>>();
    break;
  case UBIGINT:
    make_uniq<duckdb::NumericStatsUnifier<unsigned_long>>();
    break;
  case TIMESTAMP_TZ:
    make_uniq<duckdb::NumericStatsUnifier<duckdb::timestamp_tz_t>>();
    break;
  case TIME_TZ:
    make_uniq<duckdb::NumericStatsUnifier<duckdb::dtime_tz_t>>();
    break;
  case UUID:
    make_uniq<duckdb::UUIDStatsUnifier>();
  }
  *(undefined8 *)this = local_18;
  return (unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>_>)
         (unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>_>)
         this;
}

Assistant:

unique_ptr<ColumnStatsUnifier> GetBaseStatsUnifier(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::BOOLEAN:
		return make_uniq<NullStatsUnifier>();
	case LogicalTypeId::TINYINT:
	case LogicalTypeId::SMALLINT:
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::UTINYINT:
	case LogicalTypeId::USMALLINT:
		return make_uniq<NumericStatsUnifier<int32_t>>();
	case LogicalTypeId::DATE:
		return make_uniq<NumericStatsUnifier<date_t>>();
	case LogicalTypeId::BIGINT:
		return make_uniq<NumericStatsUnifier<int64_t>>();
	case LogicalTypeId::TIME:
		return make_uniq<NumericStatsUnifier<dtime_t>>();
	case LogicalTypeId::TIMESTAMP_SEC:
	case LogicalTypeId::TIMESTAMP:
		return make_uniq<NumericStatsUnifier<timestamp_t>>();
	case LogicalTypeId::TIMESTAMP_TZ:
		return make_uniq<NumericStatsUnifier<timestamp_tz_t>>();
	case LogicalTypeId::TIMESTAMP_MS:
		return make_uniq<NumericStatsUnifier<timestamp_ms_t>>();
	case LogicalTypeId::TIMESTAMP_NS:
		return make_uniq<NumericStatsUnifier<timestamp_ns_t>>();
	case LogicalTypeId::TIME_TZ:
		return make_uniq<NumericStatsUnifier<dtime_tz_t>>();
	case LogicalTypeId::UINTEGER:
		return make_uniq<NumericStatsUnifier<uint32_t>>();
	case LogicalTypeId::UBIGINT:
		return make_uniq<NumericStatsUnifier<uint64_t>>();
	case LogicalTypeId::FLOAT:
		return make_uniq<NumericStatsUnifier<float>>();
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::UHUGEINT:
	case LogicalTypeId::DOUBLE:
		return make_uniq<NumericStatsUnifier<double>>();
	case LogicalTypeId::DECIMAL: {
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		switch (type.InternalType()) {
		case PhysicalType::INT16:
		case PhysicalType::INT32:
			return make_uniq<DecimalStatsUnifier<int32_t>>(width, scale);
		case PhysicalType::INT64:
			return make_uniq<DecimalStatsUnifier<int64_t>>(width, scale);
		default:
			return make_uniq<NullStatsUnifier>();
		}
	}
	case LogicalTypeId::BLOB:
		return make_uniq<BlobStatsUnifier>();
	case LogicalTypeId::VARCHAR:
		return make_uniq<StringStatsUnifier>();
	case LogicalTypeId::UUID:
		return make_uniq<UUIDStatsUnifier>();
	case LogicalTypeId::INTERVAL:;
	case LogicalTypeId::ENUM:
	default:
		return make_uniq<NullStatsUnifier>();
	}
}